

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O1

void do_pktrack(CHAR_DATA *ch,char *argument)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  BUFFER *buffer;
  char *pcVar5;
  MYSQL *pMVar6;
  long lVar7;
  undefined8 *puVar8;
  ulong uVar9;
  char *__format;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string query;
  char *local_3888 [3];
  buffer<char> local_3870;
  char local_3850 [504];
  char qpart [4608];
  char arg1 [4608];
  char buf [4608];
  
  bVar3 = str_cmp(argument,"");
  if (!bVar3) {
    send_to_char("Syntax: pktrack <wins/losses/all/date/location> <value>\n\r",ch);
    return;
  }
  buffer = new_buf();
  pcVar5 = one_argument(argument,arg1);
  bVar3 = str_cmp(arg1,"wins");
  if (bVar3) {
    bVar3 = str_cmp(arg1,"losses");
    if (!bVar3) {
      __format = "victim RLIKE \'%s\'";
      goto LAB_002d7291;
    }
    bVar3 = str_cmp(arg1,"all");
    if (bVar3) {
      bVar3 = str_cmp(arg1,"date");
      if (bVar3) {
        bVar3 = str_cmp(arg1,"location");
        if (bVar3) {
          send_to_char("Invalid option.\n\r",ch);
          return;
        }
        __format = "room RLIKE \'%s\'";
      }
      else {
        __format = "date RLIKE \'%s\'";
      }
      goto LAB_002d7291;
    }
    sprintf(qpart,"killer RLIKE \'%s\' OR victim RLIKE \'%s\'",pcVar5,pcVar5);
  }
  else {
    __format = "killer RLIKE \'%s\'";
LAB_002d7291:
    sprintf(qpart,__format,pcVar5);
  }
  local_3888[0] = qpart;
  local_3870.size_ = 0;
  local_3870._vptr_buffer = (_func_int **)&PTR_grow_00457340;
  local_3870.capacity_ = 500;
  fmt.size_ = 0x1d;
  fmt.data_ = "SELECT * FROM pklogs WHERE {}";
  args.field_1.values_ =
       (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_3888;
  args.desc_ = 0xc;
  local_3870.ptr_ = local_3850;
  ::fmt::v9::detail::vformat_to<char>(&local_3870,fmt,args,(locale_ref)0x0);
  query._M_dataplus._M_p = (pointer)&query.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&query,local_3870.ptr_,local_3870.ptr_ + local_3870.size_);
  if (local_3870.ptr_ != local_3850) {
    operator_delete(local_3870.ptr_,local_3870.capacity_);
  }
  pMVar6 = open_conn();
  mysql_query(pMVar6,query._M_dataplus._M_p);
  lVar7 = mysql_store_result(pMVar6);
  if (lVar7 == 0) {
    iVar4 = mysql_field_count(pMVar6);
    if (iVar4 != 0) {
      send_to_char("Error accessing results.\n\r",ch);
    }
  }
  else {
    uVar9 = 1;
    bVar3 = false;
    while (puVar8 = (undefined8 *)mysql_fetch_row(lVar7), puVar8 != (undefined8 *)0x0) {
      uVar1 = *puVar8;
      iVar4 = atoi((char *)puVar8[1]);
      pcVar5 = cabal_table[iVar4].name;
      uVar2 = puVar8[2];
      iVar4 = atoi((char *)puVar8[3]);
      sprintf(buf,"%3d) %s(%s) killed %s(%s) at %s on %s\n\r",uVar9,uVar1,pcVar5,uVar2,
              cabal_table[iVar4].name,puVar8[5],puVar8[4]);
      uVar9 = (ulong)((int)uVar9 + 1);
      bVar3 = true;
      add_buf(buffer,buf);
    }
    if (!bVar3) {
      send_to_char("No matching results found.\n\r",ch);
      goto LAB_002d747b;
    }
    mysql_free_result(lVar7);
    pcVar5 = buf_string(buffer);
    page_to_char(pcVar5,ch);
    free_buf(buffer);
  }
  mysql_close(pMVar6);
LAB_002d747b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)query._M_dataplus._M_p != &query.field_2) {
    operator_delete(query._M_dataplus._M_p,query.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void do_pktrack(CHAR_DATA *ch, char *argument)
{
	MYSQL *conn;
	MYSQL_ROW row;
	MYSQL_RES *res_set;
	BUFFER *buffer;
	char arg1[MSL], qpart[MSL], buf[MSL];
	int i = 0;
	bool found= false;

	if (!str_cmp(argument, ""))
	{
		send_to_char("Syntax: pktrack <wins/losses/all/date/location> <value>\n\r", ch);
		return;
	}

	buffer = new_buf();
	argument = one_argument(argument, arg1);

	if (!str_cmp(arg1, "wins"))
	{
		sprintf(qpart, "killer RLIKE '%s'", argument);
	}
	else if (!str_cmp(arg1, "losses"))
	{
		sprintf(qpart, "victim RLIKE '%s'", argument);
	}
	else if (!str_cmp(arg1, "all"))
	{
		sprintf(qpart, "killer RLIKE '%s' OR victim RLIKE '%s'", argument, argument);
	}
	else if (!str_cmp(arg1, "date"))
	{
		sprintf(qpart, "date RLIKE '%s'", argument);
	}
	else if (!str_cmp(arg1, "location"))
	{
		sprintf(qpart, "room RLIKE '%s'", argument);
	}
	else
	{
		send_to_char("Invalid option.\n\r", ch);
		return;
	}

	auto query = fmt::format("SELECT * FROM pklogs WHERE {}", qpart);
	conn = open_conn();
	mysql_query(conn, query.c_str());
	res_set = mysql_store_result(conn);

	if (res_set == nullptr && mysql_field_count(conn) > 0)
	{
		send_to_char("Error accessing results.\n\r", ch);
	}
	else if (res_set)
	{
		while ((row = mysql_fetch_row(res_set)) != nullptr)
		{
			sprintf(buf, "%3d) %s(%s) killed %s(%s) at %s on %s\n\r",
				++i,
				row[0],
				cabal_table[atoi(row[1])].name,
				row[2],
				cabal_table[atoi(row[3])].name, row[5],
				row[4]);

			add_buf(buffer, buf);
			found = true;
		}

		if (!found)
		{
			send_to_char("No matching results found.\n\r", ch);
			return;
		}

		mysql_free_result(res_set);
		page_to_char(buf_string(buffer), ch);
		free_buf(buffer);
	}

	mysql_close(conn);
}